

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::UInt64Field::UInt64Field(UInt64Field *this,int field,uint64_t data)

{
  string sStack_38;
  
  IntTConvertor<unsigned_long>::convert_abi_cxx11_
            (&sStack_38,(IntTConvertor<unsigned_long> *)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011bb70;
  return;
}

Assistant:

explicit UInt64Field(int field, uint64_t data)
      : FieldBase(field, UInt64Convertor::convert(data)) {}